

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void applyNumericAffinity(Mem *pRec)

{
  u8 enc_00;
  int iVar1;
  i64 iStack_20;
  u8 enc;
  i64 iValue;
  double rValue;
  Mem *pRec_local;
  
  if ((((pRec->flags & 0xc) == 0) && (enc_00 = pRec->enc, (pRec->flags & 2) != 0)) &&
     (rValue = (double)pRec, iVar1 = sqlite3AtoF(pRec->z,(double *)&iValue,pRec->n,enc_00),
     iVar1 != 0)) {
    iVar1 = sqlite3Atoi64(*(char **)((long)rValue + 8),&stack0xffffffffffffffe0,
                          *(int *)((long)rValue + 0x20),enc_00);
    if (iVar1 == 0) {
      *(i64 *)((long)rValue + 0x18) = iStack_20;
      *(ushort *)((long)rValue + 0x24) = *(ushort *)((long)rValue + 0x24) | 4;
    }
    else {
      *(i64 *)((long)rValue + 0x10) = iValue;
      *(ushort *)((long)rValue + 0x24) = *(ushort *)((long)rValue + 0x24) | 8;
    }
  }
  return;
}

Assistant:

static void applyNumericAffinity(Mem *pRec){
  if( (pRec->flags & (MEM_Real|MEM_Int))==0 ){
    double rValue;
    i64 iValue;
    u8 enc = pRec->enc;
    if( (pRec->flags&MEM_Str)==0 ) return;
    if( sqlite3AtoF(pRec->z, &rValue, pRec->n, enc)==0 ) return;
    if( 0==sqlite3Atoi64(pRec->z, &iValue, pRec->n, enc) ){
      pRec->u.i = iValue;
      pRec->flags |= MEM_Int;
    }else{
      pRec->r = rValue;
      pRec->flags |= MEM_Real;
    }
  }
}